

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::rectMesh(Mesh *__return_storage_ptr__,float _x,float _y,float _w,float _h)

{
  float in_XMM0_Db;
  float in_XMM1_Db;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_40;
  float local_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_28 = _x + _x + -1.0;
  fStack_24 = _y + _y + -1.0;
  fStack_20 = in_XMM0_Db + in_XMM0_Db + 0.0;
  fStack_1c = in_XMM1_Db + in_XMM1_Db + 0.0;
  local_40 = _w;
  local_3c = _h;
  Mesh::Mesh(__return_storage_ptr__);
  local_58._4_4_ = fStack_24;
  local_58._0_4_ = local_28;
  uStack_50 = (ulong)(uint)uStack_50._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_50._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_58);
  local_40 = local_40 + local_40 + local_28;
  local_38 = fStack_24;
  fStack_34 = fStack_24;
  fStack_30 = fStack_24;
  fStack_2c = fStack_24;
  local_58._4_4_ = fStack_24;
  local_58._0_4_ = local_40;
  uStack_50 = (ulong)(uint)uStack_50._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_50._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_58);
  local_38 = local_38 + local_3c + local_3c;
  local_58._4_4_ = local_38;
  local_58._0_4_ = local_40;
  uStack_50 = (ulong)(uint)uStack_50._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_50._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_58);
  local_58._4_4_ = local_38;
  local_58._0_4_ = local_28;
  uStack_50 = (ulong)(uint)uStack_50._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_50._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_50._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_50._0_4_ = 1.0;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_58);
  local_58._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_58._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_58);
  Mesh::addIndex(__return_storage_ptr__,0);
  Mesh::addIndex(__return_storage_ptr__,1);
  Mesh::addIndex(__return_storage_ptr__,2);
  Mesh::addIndex(__return_storage_ptr__,2);
  Mesh::addIndex(__return_storage_ptr__,3);
  Mesh::addIndex(__return_storage_ptr__,0);
  return __return_storage_ptr__;
}

Assistant:

Mesh rectMesh(float _x, float _y, float _w, float _h) {
    float x = _x * 2.0f - 1.0f;
    float y = _y * 2.0f - 1.0f;
    float w = _w * 2.0f;
    float h = _h * 2.0f;

    Mesh mesh;
    mesh.addVertex(glm::vec3(x, y, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(0.0, 0.0));

    mesh.addVertex(glm::vec3(x+w, y, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(1.0, 0.0));

    mesh.addVertex(glm::vec3(x+w, y+h, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(1.0, 1.0));

    mesh.addVertex(glm::vec3(x, y+h, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(0.0, 1.0));

    mesh.addIndex(0);   mesh.addIndex(1);   mesh.addIndex(2);
    mesh.addIndex(2);   mesh.addIndex(3);   mesh.addIndex(0);

    return mesh;
}